

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

spv_result_t
spvBinaryToText(spv_const_context context,uint32_t *code,size_t wordCount,uint32_t options,
               spv_text *pText,spv_diagnostic *pDiagnostic)

{
  undefined8 __p;
  bool bVar1;
  spv_result_t sVar2;
  unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
  friendly_mapper;
  size_t wordCount_local;
  uint32_t *code_local;
  NameMapper name_mapper;
  spv_context_t *local_300;
  spv_context_t hijack_context;
  _Any_data local_2b8;
  code *local_2a8;
  undefined1 local_298 [24];
  spv_ext_inst_table local_280;
  Disassembler disassembler;
  
  wordCount_local = wordCount;
  code_local = code;
  spv_context_t::spv_context_t(&hijack_context,context);
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context,pDiagnostic);
  }
  local_298._0_4_ = hijack_context.target_env;
  local_298._8_8_ = hijack_context.operand_table;
  local_298._16_4_ = (int)hijack_context.opcode_table;
  local_298._20_4_ = hijack_context.opcode_table._4_4_;
  local_280 = hijack_context.ext_inst_table;
  bVar1 = spvtools::AssemblyGrammar::isValid((AssemblyGrammar *)local_298);
  if (bVar1) {
    friendly_mapper._M_t.
    super___uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::FriendlyNameMapper_*,_std::default_delete<spvtools::FriendlyNameMapper>_>
    .super__Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>,_true,_true>
          )(__uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
            )0x0;
    spvtools::GetTrivialNameMapper_abi_cxx11_();
    if ((options & 0x40) != 0) {
      local_300 = &hijack_context;
      spvtools::
      MakeUnique<spvtools::FriendlyNameMapper,spv_context_t*,unsigned_int_const*&,unsigned_long_const&>
                ((spvtools *)&disassembler,&local_300,&code_local,&wordCount_local);
      __p = disassembler._0_8_;
      disassembler.print_ = false;
      disassembler.nested_indent_ = false;
      disassembler.reorder_blocks_ = false;
      disassembler._3_1_ = 0;
      disassembler.endian_ = SPV_ENDIANNESS_LITTLE;
      std::
      __uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
      ::reset((__uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
               *)&friendly_mapper,(pointer)__p);
      std::
      unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
      ~unique_ptr((unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                   *)&disassembler);
      disassembler.text_ = (stringstream)0x0;
      disassembler._9_7_ = 0;
      disassembler._0_8_ =
           friendly_mapper._M_t.
           super___uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::FriendlyNameMapper_*,_std::default_delete<spvtools::FriendlyNameMapper>_>
           .super__Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false>._M_head_impl;
      disassembler._24_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/name_mapper.h:73:12)>
           ::_M_invoke;
      disassembler._16_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/name_mapper.h:73:12)>
           ::_M_manager;
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::operator=(&name_mapper,
                  (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&disassembler);
      if (disassembler._16_8_ != 0) {
        (*(code *)disassembler._16_8_)(&disassembler,&disassembler,3);
      }
    }
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                *)&local_2b8,&name_mapper);
    spvtools::anon_unknown_0::Disassembler::Disassembler
              (&disassembler,(AssemblyGrammar *)local_298,options,(NameMapper *)&local_2b8);
    if (local_2a8 != (code *)0x0) {
      (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
    }
    sVar2 = spvBinaryParse(&hijack_context,&disassembler,code_local,wordCount_local,
                           spvtools::anon_unknown_0::DisassembleHeader,
                           spvtools::anon_unknown_0::DisassembleInstruction,pDiagnostic);
    if (sVar2 == SPV_SUCCESS) {
      spvtools::anon_unknown_0::Disassembler::SaveTextResult(&disassembler,pText);
    }
    spvtools::anon_unknown_0::Disassembler::~Disassembler(&disassembler);
    if (name_mapper.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*name_mapper.super__Function_base._M_manager)
                ((_Any_data *)&name_mapper,(_Any_data *)&name_mapper,__destroy_functor);
    }
    std::
    unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
    ~unique_ptr(&friendly_mapper);
  }
  else {
    sVar2 = SPV_ERROR_INVALID_TABLE;
  }
  if (hijack_context.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*hijack_context.consumer.super__Function_base._M_manager)
              ((_Any_data *)&hijack_context.consumer,(_Any_data *)&hijack_context.consumer,
               __destroy_functor);
  }
  return sVar2;
}

Assistant:

spv_result_t spvBinaryToText(const spv_const_context context,
                             const uint32_t* code, const size_t wordCount,
                             const uint32_t options, spv_text* pText,
                             spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  const spvtools::AssemblyGrammar grammar(&hijack_context);
  if (!grammar.isValid()) return SPV_ERROR_INVALID_TABLE;

  // Generate friendly names for Ids if requested.
  std::unique_ptr<spvtools::FriendlyNameMapper> friendly_mapper;
  spvtools::NameMapper name_mapper = spvtools::GetTrivialNameMapper();
  if (options & SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES) {
    friendly_mapper = spvtools::MakeUnique<spvtools::FriendlyNameMapper>(
        &hijack_context, code, wordCount);
    name_mapper = friendly_mapper->GetNameMapper();
  }

  // Now disassemble!
  spvtools::Disassembler disassembler(grammar, options, name_mapper);
  if (auto error =
          spvBinaryParse(&hijack_context, &disassembler, code, wordCount,
                         spvtools::DisassembleHeader,
                         spvtools::DisassembleInstruction, pDiagnostic)) {
    return error;
  }

  return disassembler.SaveTextResult(pText);
}